

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint32_t FNV32a_YoshimitsuTRIAD(char *key,int len,uint32_t seed)

{
  uint *puVar1;
  ushort *puVar2;
  uint uVar3;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *p;
  uint *puVar8;
  long lVar9;
  uint uVar4;
  
  uVar5 = 0x811c9dc5;
  puVar8 = (uint *)(key + 0x10);
  uVar6 = seed ^ 0x811c9dc5;
  uVar7 = len + 0x811c9dc5;
  lVar9 = 0x10;
  for (; 0x17 < (uint)len; len = len - 0x18) {
    lVar9 = lVar9 + 0x18;
    uVar7 = ((puVar8[-2] >> 0x1b | puVar8[-2] << 5) ^ puVar8[-1] ^ uVar7) * 0xad3e7;
    uVar3 = *puVar8;
    uVar4 = *puVar8;
    uVar6 = ((puVar8[-4] >> 0x1b | puVar8[-4] << 5) ^ puVar8[-3] ^ uVar6) * 0xad3e7;
    puVar1 = puVar8 + 1;
    puVar8 = puVar8 + 6;
    uVar5 = ((uVar3 >> 0x1b | uVar4 << 5) ^ *puVar1 ^ uVar5) * 0xad3e7;
  }
  uVar5 = ((uVar5 >> 0x1b | uVar5 << 5) ^ uVar6) * 0xad3e7;
  if (lVar9 == 0x10) {
    uVar5 = uVar6;
  }
  if ((uint)len < 0x10) {
    puVar8 = puVar8 + -4;
  }
  else {
    uVar5 = ((puVar8[-4] >> 0x1b | puVar8[-4] << 5) ^ puVar8[-3] ^ uVar5) * 0xad3e7;
    uVar7 = ((puVar8[-2] >> 0x1b | puVar8[-2] << 5) ^ puVar8[-1] ^ uVar7) * 0xad3e7;
  }
  if ((len & 8U) != 0) {
    uVar6 = *puVar8;
    puVar1 = puVar8 + 1;
    puVar8 = puVar8 + 2;
    uVar5 = (uVar5 ^ uVar6) * 0xad3e7;
    uVar7 = (uVar7 ^ *puVar1) * 0xad3e7;
  }
  if ((len & 4U) != 0) {
    uVar6 = *puVar8;
    puVar2 = (ushort *)((long)puVar8 + 2);
    puVar8 = puVar8 + 1;
    uVar5 = (uVar5 ^ (ushort)uVar6) * 0xad3e7;
    uVar7 = (uVar7 ^ *puVar2) * 0xad3e7;
  }
  if ((len & 2U) != 0) {
    uVar6 = *puVar8;
    puVar8 = (uint *)((long)puVar8 + 2);
    uVar5 = (uVar5 ^ (ushort)uVar6) * 0xad3e7;
  }
  if ((len & 1U) != 0) {
    uVar5 = (uVar5 ^ (byte)*puVar8) * 0xad3e7;
  }
  uVar5 = ((uVar7 >> 0x1b | uVar7 << 5) ^ uVar5) * 0xad3e7;
  return uVar5 >> 0x10 ^ uVar5;
}

Assistant:

uint32_t
FNV32a_YoshimitsuTRIAD(const char *key, int len, uint32_t seed)
{
  const uint8_t  *p = (const uint8_t *)key;
  const uint32_t  PRIME = 709607;
  uint32_t	  hash32A = seed ^ UINT32_C(2166136261);
  uint32_t	  hash32B = UINT32_C(2166136261) + len;
  uint32_t	  hash32C = UINT32_C(2166136261);

  for (; len >= 3 * 2 * sizeof(uint32_t); len -= 3 * 2 * sizeof(uint32_t), p += 3 * 2 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ (ROTL32(*(uint32_t *) (p + 0), 5)  ^ *(uint32_t *) (p + 4)))  * PRIME;
    hash32B = (hash32B ^ (ROTL32(*(uint32_t *) (p + 8), 5)  ^ *(uint32_t *) (p + 12))) * PRIME;
    hash32C = (hash32C ^ (ROTL32(*(uint32_t *) (p + 16), 5) ^ *(uint32_t *) (p + 20))) * PRIME;
  }
  if (p != (const uint8_t *)key) {
    hash32A = (hash32A ^ ROTL32(hash32C, 5)) * PRIME;
  }
  //Cases 0. .31
  if (len & 4 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ (ROTL32(*(uint32_t *) (p + 0), 5) ^ *(uint32_t *) (p + 4))) * PRIME;
    hash32B = (hash32B ^ (ROTL32(*(uint32_t *) (p + 8), 5) ^ *(uint32_t *) (p + 12))) * PRIME;
    p += 8 * sizeof(uint16_t);
  }
  //Cases 0. .15
  if (len & 2 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ *(uint32_t *) (p + 0)) * PRIME;
    hash32B = (hash32B ^ *(uint32_t *) (p + 4)) * PRIME;
    p += 4 * sizeof(uint16_t);
  }
  //Cases:0. .7
  if (len & sizeof(uint32_t)) {
    hash32A = (hash32A ^ *(uint16_t *) (p + 0)) * PRIME;
    hash32B = (hash32B ^ *(uint16_t *) (p + 2)) * PRIME;
    p += 2 * sizeof(uint16_t);
  }
  //Cases:0. .3
  if (len & sizeof(uint16_t)) {
    hash32A = (hash32A ^ *(uint16_t *) p) * PRIME;
    p += sizeof(uint16_t);
  }
  if (len & 1)
    hash32A = (hash32A ^ *p) * PRIME;

  hash32A = (hash32A ^ ROTL32(hash32B, 5)) * PRIME;
  return hash32A ^ (hash32A >> 16);
}